

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

NetAliasSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NetAliasSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *args_2,Token *args_3)

{
  Token keyword;
  NetAliasSyntax *pNVar1;
  NetAliasSyntax *in_RCX;
  long in_RDX;
  Info *in_RSI;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_R8;
  Token in_stack_00000000;
  size_t in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  BumpAllocator *in_stack_ffffffffffffffb8;
  
  pNVar1 = (NetAliasSyntax *)
           allocate(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  keyword.info = in_RSI;
  keyword.kind = (short)in_RDX;
  keyword._2_1_ = (char)((ulong)in_RDX >> 0x10);
  keyword.numFlags.raw = (char)((ulong)in_RDX >> 0x18);
  keyword.rawLen = (int)((ulong)in_RDX >> 0x20);
  slang::syntax::NetAliasSyntax::NetAliasSyntax
            (in_RCX,in_R8,keyword,
             *(SeparatedSyntaxList<slang::syntax::ExpressionSyntax> **)(in_RDX + 8),
             in_stack_00000000);
  return pNVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }